

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O3

void embree::avx2::
     BVHNIntersectorKHybrid<4,_8,_1,_false,_embree::avx2::ArrayIntersectorK_1<8,_embree::avx2::QuadMvIntersectorKMoeller<4,_8,_true>_>,_true>
     ::intersect1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,
                 RayHitK<8> *ray,TravRayK<8,_false> *tray,RayQueryContext *context)

{
  long lVar1;
  float fVar2;
  float fVar3;
  undefined4 uVar4;
  Scene *pSVar5;
  Geometry *pGVar6;
  RTCFilterFunctionN p_Var7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [16];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 (*pauVar26) [16];
  int iVar27;
  uint uVar28;
  undefined1 (*pauVar29) [16];
  long lVar30;
  ulong uVar31;
  byte bVar32;
  uint uVar33;
  ulong uVar34;
  ulong uVar35;
  long lVar36;
  ulong uVar37;
  ulong uVar38;
  ulong uVar39;
  ulong uVar40;
  vint4 bi_1;
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [64];
  undefined1 auVar45 [16];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  vint4 bi;
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  vint4 ai;
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [16];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [64];
  float fVar66;
  undefined1 auVar67 [32];
  float fVar69;
  float fVar70;
  float fVar71;
  undefined1 auVar68 [64];
  undefined1 auVar72 [32];
  uint uVar74;
  uint uVar75;
  undefined1 auVar73 [64];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [64];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [64];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [64];
  undefined4 uVar86;
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [64];
  RTCFilterFunctionNArguments args;
  vbool<8> valid;
  vfloat<4> tNear;
  StackItemT<embree::NodeRefPtr<4>_> stack [244];
  RTCFilterFunctionNArguments local_1470;
  undefined1 local_1440 [32];
  undefined1 local_1420 [32];
  undefined1 local_1400 [32];
  undefined1 local_13d0 [16];
  undefined1 local_13c0 [16];
  undefined1 local_13b0 [16];
  undefined1 local_13a0 [16];
  undefined1 local_1390 [16];
  undefined1 local_1380 [16];
  undefined1 local_1370 [16];
  undefined8 local_1360;
  undefined8 uStack_1358;
  undefined8 uStack_1350;
  undefined8 uStack_1348;
  undefined1 local_1340 [32];
  undefined1 local_1320 [32];
  undefined1 local_1300 [32];
  undefined1 local_12e0 [32];
  undefined1 local_12c0 [32];
  undefined1 local_12a0 [32];
  undefined1 local_1280 [32];
  undefined1 local_1260 [32];
  undefined1 local_1240 [32];
  undefined1 local_1220 [32];
  undefined1 local_1200 [32];
  undefined1 local_11e0 [32];
  undefined1 local_11c0 [32];
  undefined1 local_11a0 [32];
  undefined1 local_1180 [32];
  undefined1 local_1160 [32];
  undefined1 local_1140 [32];
  undefined1 local_1120 [32];
  undefined1 local_1100 [32];
  undefined8 local_10e0;
  undefined8 uStack_10d8;
  undefined8 uStack_10d0;
  undefined8 uStack_10c8;
  RTCHitN local_10c0 [32];
  undefined1 local_10a0 [32];
  undefined1 local_1080 [32];
  undefined1 local_1060 [32];
  undefined4 local_1040;
  undefined4 uStack_103c;
  undefined4 uStack_1038;
  undefined4 uStack_1034;
  undefined4 uStack_1030;
  undefined4 uStack_102c;
  undefined4 uStack_1028;
  undefined4 uStack_1024;
  undefined1 local_1020 [32];
  undefined1 local_1000 [32];
  uint local_fe0;
  uint uStack_fdc;
  uint uStack_fd8;
  uint uStack_fd4;
  uint uStack_fd0;
  uint uStack_fcc;
  uint uStack_fc8;
  uint uStack_fc4;
  uint local_fc0;
  uint uStack_fbc;
  uint uStack_fb8;
  uint uStack_fb4;
  uint uStack_fb0;
  uint uStack_fac;
  uint uStack_fa8;
  uint uStack_fa4;
  size_t local_fa0;
  undefined4 uStack_f98;
  undefined1 local_f90 [3936];
  undefined1 auVar53 [32];
  undefined1 auVar57 [32];
  
  pauVar29 = (undefined1 (*) [16])local_f90;
  local_fa0 = root.ptr;
  uStack_f98 = 0;
  fVar2 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  auVar91 = ZEXT1664(CONCAT412(fVar2,CONCAT48(fVar2,CONCAT44(fVar2,fVar2))));
  fVar3 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  local_1370._4_4_ = fVar3;
  local_1370._0_4_ = fVar3;
  local_1370._8_4_ = fVar3;
  local_1370._12_4_ = fVar3;
  auVar65 = ZEXT1664(local_1370);
  fVar66 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x40);
  local_1380._4_4_ = fVar66;
  local_1380._0_4_ = fVar66;
  local_1380._8_4_ = fVar66;
  local_1380._12_4_ = fVar66;
  auVar68 = ZEXT1664(local_1380);
  fVar2 = fVar2 * *(float *)((long)&(tray->org).field_0 + k * 4);
  fVar3 = fVar3 * *(float *)((long)&(tray->org).field_0 + k * 4 + 0x20);
  fVar66 = fVar66 * *(float *)((long)&(tray->org).field_0 + k * 4 + 0x40);
  uVar37 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  uVar39 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  uVar40 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x40);
  iVar27 = (tray->tfar).field_0.i[k];
  auVar44 = ZEXT1664(CONCAT412(iVar27,CONCAT48(iVar27,CONCAT44(iVar27,iVar27))));
  local_1390._0_8_ = CONCAT44(fVar2,fVar2) ^ 0x8000000080000000;
  local_1390._8_4_ = -fVar2;
  local_1390._12_4_ = -fVar2;
  auVar73 = ZEXT1664(local_1390);
  local_13a0._0_8_ = CONCAT44(fVar3,fVar3) ^ 0x8000000080000000;
  local_13a0._8_4_ = -fVar3;
  local_13a0._12_4_ = -fVar3;
  auVar78 = ZEXT1664(local_13a0);
  local_13b0._0_8_ = CONCAT44(fVar66,fVar66) ^ 0x8000000080000000;
  local_13b0._8_4_ = -fVar66;
  local_13b0._12_4_ = -fVar66;
  auVar81 = ZEXT1664(local_13b0);
  iVar27 = (tray->tnear).field_0.i[k];
  local_13c0._4_4_ = iVar27;
  local_13c0._0_4_ = iVar27;
  local_13c0._8_4_ = iVar27;
  local_13c0._12_4_ = iVar27;
  auVar85 = ZEXT1664(local_13c0);
  local_1100._16_16_ = mm_lookupmask_ps._240_16_;
  local_1100._0_16_ = mm_lookupmask_ps._0_16_;
  iVar27 = 1 << ((uint)k & 0x1f);
  auVar64._4_4_ = iVar27;
  auVar64._0_4_ = iVar27;
  auVar64._8_4_ = iVar27;
  auVar64._12_4_ = iVar27;
  auVar64._16_4_ = iVar27;
  auVar64._20_4_ = iVar27;
  auVar64._24_4_ = iVar27;
  auVar64._28_4_ = iVar27;
  auVar46 = vpmovzxbd_avx2(ZEXT816(0x8040201008040201));
  auVar64 = vpand_avx2(auVar64,auVar46);
  local_1140 = vpcmpeqd_avx2(auVar64,auVar46);
  auVar51._8_4_ = 0x3f800000;
  auVar51._0_8_ = 0x3f8000003f800000;
  auVar51._12_4_ = 0x3f800000;
  auVar51._16_4_ = 0x3f800000;
  auVar51._20_4_ = 0x3f800000;
  auVar51._24_4_ = 0x3f800000;
  auVar51._28_4_ = 0x3f800000;
  auVar46._8_4_ = 0xbf800000;
  auVar46._0_8_ = 0xbf800000bf800000;
  auVar46._12_4_ = 0xbf800000;
  auVar46._16_4_ = 0xbf800000;
  auVar46._20_4_ = 0xbf800000;
  auVar46._24_4_ = 0xbf800000;
  auVar46._28_4_ = 0xbf800000;
  local_1120 = vblendvps_avx(auVar51,auVar46,local_1100);
LAB_0056eb9d:
  do {
    pauVar26 = pauVar29 + -1;
    pauVar29 = pauVar29 + -1;
    if (*(float *)(*pauVar26 + 8) <= *(float *)(ray + k * 4 + 0x100)) {
      uVar34 = *(ulong *)*pauVar29;
      while ((uVar34 & 8) == 0) {
        auVar45 = vfmadd132ps_fma(*(undefined1 (*) [16])(uVar34 + 0x20 + uVar37),auVar73._0_16_,
                                  auVar91._0_16_);
        auVar49 = vfmadd132ps_fma(*(undefined1 (*) [16])(uVar34 + 0x20 + uVar39),auVar78._0_16_,
                                  auVar65._0_16_);
        auVar45 = vpmaxsd_avx(auVar45,auVar49);
        auVar49 = vfmadd132ps_fma(*(undefined1 (*) [16])(uVar34 + 0x20 + uVar40),auVar81._0_16_,
                                  auVar68._0_16_);
        auVar49 = vpmaxsd_avx(auVar49,auVar85._0_16_);
        auVar49 = vpmaxsd_avx(auVar45,auVar49);
        auVar45 = vfmadd132ps_fma(*(undefined1 (*) [16])(uVar34 + 0x20 + (uVar37 ^ 0x10)),
                                  auVar73._0_16_,auVar91._0_16_);
        auVar54 = vfmadd132ps_fma(*(undefined1 (*) [16])(uVar34 + 0x20 + (uVar39 ^ 0x10)),
                                  auVar78._0_16_,auVar65._0_16_);
        auVar45 = vpminsd_avx(auVar45,auVar54);
        auVar54 = vfmadd132ps_fma(*(undefined1 (*) [16])(uVar34 + 0x20 + (uVar40 ^ 0x10)),
                                  auVar81._0_16_,auVar68._0_16_);
        auVar54 = vpminsd_avx(auVar54,auVar44._0_16_);
        auVar45 = vpminsd_avx(auVar45,auVar54);
        auVar45 = vpcmpgtd_avx(auVar49,auVar45);
        iVar27 = vmovmskps_avx(auVar45);
        local_1340._0_16_ = auVar49;
        if (iVar27 == 0xf) {
          if (pauVar29 == (undefined1 (*) [16])&local_fa0) {
            return;
          }
          goto LAB_0056eb9d;
        }
        bVar32 = (byte)iVar27 ^ 0xf;
        uVar38 = uVar34 & 0xfffffffffffffff0;
        lVar36 = 0;
        for (uVar34 = (ulong)bVar32; (uVar34 & 1) == 0; uVar34 = uVar34 >> 1 | 0x8000000000000000) {
          lVar36 = lVar36 + 1;
        }
        uVar34 = *(ulong *)(uVar38 + lVar36 * 8);
        uVar33 = bVar32 - 1 & (uint)bVar32;
        uVar31 = (ulong)uVar33;
        if (uVar33 != 0) {
          uVar28 = *(uint *)(local_1340 + lVar36 * 4);
          lVar36 = 0;
          for (; (uVar31 & 1) == 0; uVar31 = uVar31 >> 1 | 0x8000000000000000) {
            lVar36 = lVar36 + 1;
          }
          uVar33 = uVar33 - 1 & uVar33;
          uVar35 = (ulong)uVar33;
          uVar31 = *(ulong *)(uVar38 + lVar36 * 8);
          uVar74 = *(uint *)(local_1340 + lVar36 * 4);
          if (uVar33 == 0) {
            if (uVar28 < uVar74) {
              *(ulong *)*pauVar29 = uVar31;
              *(uint *)(*pauVar29 + 8) = uVar74;
              pauVar29 = pauVar29 + 1;
            }
            else {
              *(ulong *)*pauVar29 = uVar34;
              *(uint *)(*pauVar29 + 8) = uVar28;
              pauVar29 = pauVar29 + 1;
              uVar34 = uVar31;
            }
          }
          else {
            auVar45._8_8_ = 0;
            auVar45._0_8_ = uVar34;
            auVar45 = vpunpcklqdq_avx(auVar45,ZEXT416(uVar28));
            auVar49._8_8_ = 0;
            auVar49._0_8_ = uVar31;
            auVar49 = vpunpcklqdq_avx(auVar49,ZEXT416(uVar74));
            lVar36 = 0;
            for (; (uVar35 & 1) == 0; uVar35 = uVar35 >> 1 | 0x8000000000000000) {
              lVar36 = lVar36 + 1;
            }
            uVar33 = uVar33 - 1 & uVar33;
            uVar34 = (ulong)uVar33;
            auVar54._8_8_ = 0;
            auVar54._0_8_ = *(ulong *)(uVar38 + lVar36 * 8);
            auVar50 = vpunpcklqdq_avx(auVar54,ZEXT416(*(uint *)(local_1340 + lVar36 * 4)));
            auVar54 = vpcmpgtd_avx(auVar49,auVar45);
            if (uVar33 == 0) {
              auVar60 = vpshufd_avx(auVar54,0xaa);
              auVar54 = vblendvps_avx(auVar49,auVar45,auVar60);
              auVar45 = vblendvps_avx(auVar45,auVar49,auVar60);
              auVar49 = vpcmpgtd_avx(auVar50,auVar54);
              auVar60 = vpshufd_avx(auVar49,0xaa);
              auVar49 = vblendvps_avx(auVar50,auVar54,auVar60);
              auVar54 = vblendvps_avx(auVar54,auVar50,auVar60);
              auVar50 = vpcmpgtd_avx(auVar54,auVar45);
              auVar60 = vpshufd_avx(auVar50,0xaa);
              auVar50 = vblendvps_avx(auVar54,auVar45,auVar60);
              auVar45 = vblendvps_avx(auVar45,auVar54,auVar60);
              *pauVar29 = auVar45;
              pauVar29[1] = auVar50;
              uVar34 = auVar49._0_8_;
              pauVar29 = pauVar29 + 2;
            }
            else {
              lVar36 = 0;
              for (; (uVar34 & 1) == 0; uVar34 = uVar34 >> 1 | 0x8000000000000000) {
                lVar36 = lVar36 + 1;
              }
              auVar60._8_8_ = 0;
              auVar60._0_8_ = *(ulong *)(uVar38 + lVar36 * 8);
              auVar55 = vpunpcklqdq_avx(auVar60,ZEXT416(*(uint *)(local_1340 + lVar36 * 4)));
              auVar60 = vpshufd_avx(auVar54,0xaa);
              auVar54 = vblendvps_avx(auVar49,auVar45,auVar60);
              auVar45 = vblendvps_avx(auVar45,auVar49,auVar60);
              auVar49 = vpcmpgtd_avx(auVar55,auVar50);
              auVar60 = vpshufd_avx(auVar49,0xaa);
              auVar49 = vblendvps_avx(auVar55,auVar50,auVar60);
              auVar50 = vblendvps_avx(auVar50,auVar55,auVar60);
              auVar60 = vpcmpgtd_avx(auVar50,auVar45);
              auVar55 = vpshufd_avx(auVar60,0xaa);
              auVar60 = vblendvps_avx(auVar50,auVar45,auVar55);
              auVar45 = vblendvps_avx(auVar45,auVar50,auVar55);
              auVar50 = vpcmpgtd_avx(auVar49,auVar54);
              auVar55 = vpshufd_avx(auVar50,0xaa);
              auVar50 = vblendvps_avx(auVar49,auVar54,auVar55);
              auVar49 = vblendvps_avx(auVar54,auVar49,auVar55);
              auVar54 = vpcmpgtd_avx(auVar60,auVar49);
              auVar55 = vpshufd_avx(auVar54,0xaa);
              auVar54 = vblendvps_avx(auVar60,auVar49,auVar55);
              auVar49 = vblendvps_avx(auVar49,auVar60,auVar55);
              *pauVar29 = auVar45;
              pauVar29[1] = auVar49;
              pauVar29[2] = auVar54;
              uVar34 = auVar50._0_8_;
              pauVar29 = pauVar29 + 3;
            }
          }
        }
      }
      uVar38 = (ulong)((uint)uVar34 & 0xf);
      if (uVar38 != 8) {
        uVar34 = uVar34 & 0xfffffffffffffff0;
        lVar36 = 0;
        do {
          lVar30 = lVar36 * 0xe0;
          lVar1 = uVar34 + 0xd0 + lVar30;
          local_1360 = *(undefined8 *)(lVar1 + 0x10);
          uStack_1358 = *(undefined8 *)(lVar1 + 0x18);
          lVar1 = uVar34 + 0xc0 + lVar30;
          local_10e0 = *(undefined8 *)(lVar1 + 0x10);
          uStack_10d8 = *(undefined8 *)(lVar1 + 0x18);
          uStack_10d0 = local_10e0;
          uStack_10c8 = uStack_10d8;
          uStack_1350 = local_1360;
          uStack_1348 = uStack_1358;
          auVar56._16_16_ = *(undefined1 (*) [16])(uVar34 + 0x60 + lVar30);
          auVar56._0_16_ = *(undefined1 (*) [16])(uVar34 + lVar30);
          auVar58._16_16_ = *(undefined1 (*) [16])(uVar34 + 0x70 + lVar30);
          auVar58._0_16_ = *(undefined1 (*) [16])(uVar34 + 0x10 + lVar30);
          auVar63._16_16_ = *(undefined1 (*) [16])(uVar34 + 0x80 + lVar30);
          auVar63._0_16_ = *(undefined1 (*) [16])(uVar34 + 0x20 + lVar30);
          auVar45 = *(undefined1 (*) [16])(uVar34 + 0x30 + lVar30);
          auVar41._16_16_ = auVar45;
          auVar41._0_16_ = auVar45;
          auVar49 = *(undefined1 (*) [16])(uVar34 + 0x40 + lVar30);
          auVar47._16_16_ = auVar49;
          auVar47._0_16_ = auVar49;
          auVar54 = *(undefined1 (*) [16])(uVar34 + 0x50 + lVar30);
          auVar52._16_16_ = auVar54;
          auVar52._0_16_ = auVar54;
          auVar54 = *(undefined1 (*) [16])(uVar34 + 0x90 + lVar30);
          auVar61._16_16_ = auVar54;
          auVar61._0_16_ = auVar54;
          auVar54 = *(undefined1 (*) [16])(uVar34 + 0xa0 + lVar30);
          auVar76._16_16_ = auVar54;
          auVar76._0_16_ = auVar54;
          auVar54 = *(undefined1 (*) [16])(uVar34 + 0xb0 + lVar30);
          auVar79._16_16_ = auVar54;
          auVar79._0_16_ = auVar54;
          auVar46 = vsubps_avx(auVar56,auVar41);
          auVar64 = vsubps_avx(auVar58,auVar47);
          auVar51 = vsubps_avx(auVar63,auVar52);
          auVar41 = vsubps_avx(auVar61,auVar56);
          auVar13 = vsubps_avx(auVar76,auVar58);
          auVar14 = vsubps_avx(auVar79,auVar63);
          auVar15._4_4_ = auVar64._4_4_ * auVar14._4_4_;
          auVar15._0_4_ = auVar64._0_4_ * auVar14._0_4_;
          auVar15._8_4_ = auVar64._8_4_ * auVar14._8_4_;
          auVar15._12_4_ = auVar64._12_4_ * auVar14._12_4_;
          auVar15._16_4_ = auVar64._16_4_ * auVar14._16_4_;
          auVar15._20_4_ = auVar64._20_4_ * auVar14._20_4_;
          auVar15._24_4_ = auVar64._24_4_ * auVar14._24_4_;
          auVar15._28_4_ = auVar45._12_4_;
          auVar50 = vfmsub231ps_fma(auVar15,auVar13,auVar51);
          auVar16._4_4_ = auVar51._4_4_ * auVar41._4_4_;
          auVar16._0_4_ = auVar51._0_4_ * auVar41._0_4_;
          auVar16._8_4_ = auVar51._8_4_ * auVar41._8_4_;
          auVar16._12_4_ = auVar51._12_4_ * auVar41._12_4_;
          auVar16._16_4_ = auVar51._16_4_ * auVar41._16_4_;
          auVar16._20_4_ = auVar51._20_4_ * auVar41._20_4_;
          auVar16._24_4_ = auVar51._24_4_ * auVar41._24_4_;
          auVar16._28_4_ = auVar49._12_4_;
          auVar60 = vfmsub231ps_fma(auVar16,auVar14,auVar46);
          uVar86 = *(undefined4 *)(ray + k * 4);
          auVar82._4_4_ = uVar86;
          auVar82._0_4_ = uVar86;
          auVar82._8_4_ = uVar86;
          auVar82._12_4_ = uVar86;
          auVar82._16_4_ = uVar86;
          auVar82._20_4_ = uVar86;
          auVar82._24_4_ = uVar86;
          auVar82._28_4_ = uVar86;
          uVar86 = *(undefined4 *)(ray + k * 4 + 0x20);
          auVar87._4_4_ = uVar86;
          auVar87._0_4_ = uVar86;
          auVar87._8_4_ = uVar86;
          auVar87._12_4_ = uVar86;
          auVar87._16_4_ = uVar86;
          auVar87._20_4_ = uVar86;
          auVar87._24_4_ = uVar86;
          auVar87._28_4_ = uVar86;
          uVar86 = *(undefined4 *)(ray + k * 4 + 0x40);
          auVar89._4_4_ = uVar86;
          auVar89._0_4_ = uVar86;
          auVar89._8_4_ = uVar86;
          auVar89._12_4_ = uVar86;
          auVar89._16_4_ = uVar86;
          auVar89._20_4_ = uVar86;
          auVar89._24_4_ = uVar86;
          auVar89._28_4_ = uVar86;
          fVar2 = *(float *)(ray + k * 4 + 0x80);
          auVar77._4_4_ = fVar2;
          auVar77._0_4_ = fVar2;
          auVar77._8_4_ = fVar2;
          auVar77._12_4_ = fVar2;
          auVar77._16_4_ = fVar2;
          auVar77._20_4_ = fVar2;
          auVar77._24_4_ = fVar2;
          auVar77._28_4_ = fVar2;
          auVar15 = vsubps_avx(auVar56,auVar82);
          fVar3 = *(float *)(ray + k * 4 + 0xa0);
          auVar83._4_4_ = fVar3;
          auVar83._0_4_ = fVar3;
          auVar83._8_4_ = fVar3;
          auVar83._12_4_ = fVar3;
          auVar83._16_4_ = fVar3;
          auVar83._20_4_ = fVar3;
          auVar83._24_4_ = fVar3;
          auVar83._28_4_ = fVar3;
          auVar16 = vsubps_avx(auVar58,auVar87);
          fVar66 = *(float *)(ray + k * 4 + 0xc0);
          auVar88._4_4_ = fVar66;
          auVar88._0_4_ = fVar66;
          auVar88._8_4_ = fVar66;
          auVar88._12_4_ = fVar66;
          auVar88._16_4_ = fVar66;
          auVar88._20_4_ = fVar66;
          auVar88._24_4_ = fVar66;
          auVar88._28_4_ = fVar66;
          auVar47 = vsubps_avx(auVar63,auVar89);
          auVar18._4_4_ = fVar2 * auVar16._4_4_;
          auVar18._0_4_ = fVar2 * auVar16._0_4_;
          auVar18._8_4_ = fVar2 * auVar16._8_4_;
          auVar18._12_4_ = fVar2 * auVar16._12_4_;
          auVar18._16_4_ = fVar2 * auVar16._16_4_;
          auVar18._20_4_ = fVar2 * auVar16._20_4_;
          auVar18._24_4_ = fVar2 * auVar16._24_4_;
          auVar18._28_4_ = uVar86;
          auVar45 = vfmsub231ps_fma(auVar18,auVar15,auVar83);
          auVar19._4_4_ = auVar14._4_4_ * auVar45._4_4_;
          auVar19._0_4_ = auVar14._0_4_ * auVar45._0_4_;
          auVar19._8_4_ = auVar14._8_4_ * auVar45._8_4_;
          auVar19._12_4_ = auVar14._12_4_ * auVar45._12_4_;
          auVar19._16_4_ = auVar14._16_4_ * 0.0;
          auVar19._20_4_ = auVar14._20_4_ * 0.0;
          auVar19._24_4_ = auVar14._24_4_ * 0.0;
          auVar19._28_4_ = auVar14._28_4_;
          auVar90._0_4_ = auVar51._0_4_ * auVar45._0_4_;
          auVar90._4_4_ = auVar51._4_4_ * auVar45._4_4_;
          auVar90._8_4_ = auVar51._8_4_ * auVar45._8_4_;
          auVar90._12_4_ = auVar51._12_4_ * auVar45._12_4_;
          auVar90._16_4_ = auVar51._16_4_ * 0.0;
          auVar90._20_4_ = auVar51._20_4_ * 0.0;
          auVar90._24_4_ = auVar51._24_4_ * 0.0;
          auVar90._28_4_ = 0;
          auVar14._4_4_ = fVar66 * auVar15._4_4_;
          auVar14._0_4_ = fVar66 * auVar15._0_4_;
          auVar14._8_4_ = fVar66 * auVar15._8_4_;
          auVar14._12_4_ = fVar66 * auVar15._12_4_;
          auVar14._16_4_ = fVar66 * auVar15._16_4_;
          auVar14._20_4_ = fVar66 * auVar15._20_4_;
          auVar14._24_4_ = fVar66 * auVar15._24_4_;
          auVar14._28_4_ = auVar51._28_4_;
          auVar49 = vfmsub231ps_fma(auVar14,auVar47,auVar77);
          auVar45 = vfmadd231ps_fma(auVar19,ZEXT1632(auVar49),auVar13);
          auVar49 = vfmadd231ps_fma(auVar90,auVar64,ZEXT1632(auVar49));
          auVar20._4_4_ = auVar46._4_4_ * auVar13._4_4_;
          auVar20._0_4_ = auVar46._0_4_ * auVar13._0_4_;
          auVar20._8_4_ = auVar46._8_4_ * auVar13._8_4_;
          auVar20._12_4_ = auVar46._12_4_ * auVar13._12_4_;
          auVar20._16_4_ = auVar46._16_4_ * auVar13._16_4_;
          auVar20._20_4_ = auVar46._20_4_ * auVar13._20_4_;
          auVar20._24_4_ = auVar46._24_4_ * auVar13._24_4_;
          auVar20._28_4_ = auVar13._28_4_;
          auVar55 = vfmsub231ps_fma(auVar20,auVar41,auVar64);
          auVar13._4_4_ = fVar3 * auVar47._4_4_;
          auVar13._0_4_ = fVar3 * auVar47._0_4_;
          auVar13._8_4_ = fVar3 * auVar47._8_4_;
          auVar13._12_4_ = fVar3 * auVar47._12_4_;
          auVar13._16_4_ = fVar3 * auVar47._16_4_;
          auVar13._20_4_ = fVar3 * auVar47._20_4_;
          auVar13._24_4_ = fVar3 * auVar47._24_4_;
          auVar13._28_4_ = auVar64._28_4_;
          auVar17 = vfmsub231ps_fma(auVar13,auVar16,auVar88);
          fVar2 = auVar55._0_4_;
          fVar3 = auVar55._4_4_;
          auVar21._4_4_ = fVar66 * fVar3;
          auVar21._0_4_ = fVar66 * fVar2;
          fVar8 = auVar55._8_4_;
          auVar21._8_4_ = fVar66 * fVar8;
          fVar9 = auVar55._12_4_;
          auVar21._12_4_ = fVar66 * fVar9;
          auVar21._16_4_ = fVar66 * 0.0;
          auVar21._20_4_ = fVar66 * 0.0;
          auVar21._24_4_ = fVar66 * 0.0;
          auVar21._28_4_ = fVar66;
          auVar54 = vfmadd231ps_fma(auVar21,ZEXT1632(auVar60),auVar83);
          auVar54 = vfmadd231ps_fma(ZEXT1632(auVar54),ZEXT1632(auVar50),auVar77);
          auVar72._8_4_ = 0x80000000;
          auVar72._0_8_ = 0x8000000080000000;
          auVar72._12_4_ = 0x80000000;
          auVar72._16_4_ = 0x80000000;
          auVar72._20_4_ = 0x80000000;
          auVar72._24_4_ = 0x80000000;
          auVar72._28_4_ = 0x80000000;
          auVar45 = vfmadd231ps_fma(ZEXT1632(auVar45),ZEXT1632(auVar17),auVar41);
          auVar64 = vandps_avx(ZEXT1632(auVar54),auVar72);
          uVar33 = auVar64._0_4_;
          auVar62._0_4_ = (float)(uVar33 ^ auVar45._0_4_);
          uVar28 = auVar64._4_4_;
          auVar62._4_4_ = (float)(uVar28 ^ auVar45._4_4_);
          uVar74 = auVar64._8_4_;
          auVar62._8_4_ = (float)(uVar74 ^ auVar45._8_4_);
          uVar75 = auVar64._12_4_;
          auVar62._12_4_ = (float)(uVar75 ^ auVar45._12_4_);
          local_1300._16_4_ = auVar64._16_4_;
          auVar62._16_4_ = local_1300._16_4_;
          local_1300._20_4_ = auVar64._20_4_;
          auVar62._20_4_ = local_1300._20_4_;
          local_1300._24_4_ = auVar64._24_4_;
          auVar62._24_4_ = local_1300._24_4_;
          local_1300._28_4_ = auVar64._28_4_;
          auVar62._28_4_ = local_1300._28_4_;
          auVar45 = vfmadd231ps_fma(ZEXT1632(auVar49),auVar46,ZEXT1632(auVar17));
          local_1320._0_4_ = (float)(uVar33 ^ auVar45._0_4_);
          local_1320._4_4_ = (float)(uVar28 ^ auVar45._4_4_);
          local_1320._8_4_ = (float)(uVar74 ^ auVar45._8_4_);
          local_1320._12_4_ = (float)(uVar75 ^ auVar45._12_4_);
          local_1320._16_4_ = local_1300._16_4_;
          local_1320._20_4_ = local_1300._20_4_;
          local_1320._24_4_ = local_1300._24_4_;
          local_1320._28_4_ = local_1300._28_4_;
          auVar64 = vcmpps_avx(auVar62,ZEXT832(0) << 0x20,5);
          auVar46 = vcmpps_avx(local_1320,ZEXT832(0) << 0x20,5);
          auVar64 = vandps_avx(auVar64,auVar46);
          auVar67._8_4_ = 0x7fffffff;
          auVar67._0_8_ = 0x7fffffff7fffffff;
          auVar67._12_4_ = 0x7fffffff;
          auVar67._16_4_ = 0x7fffffff;
          auVar67._20_4_ = 0x7fffffff;
          auVar67._24_4_ = 0x7fffffff;
          auVar67._28_4_ = 0x7fffffff;
          local_12e0 = vandps_avx(ZEXT1632(auVar54),auVar67);
          auVar46 = vcmpps_avx(ZEXT1632(auVar54),ZEXT832(0) << 0x20,4);
          auVar64 = vandps_avx(auVar64,auVar46);
          auVar80._0_4_ = auVar62._0_4_ + local_1320._0_4_;
          auVar80._4_4_ = auVar62._4_4_ + local_1320._4_4_;
          auVar80._8_4_ = auVar62._8_4_ + local_1320._8_4_;
          auVar80._12_4_ = auVar62._12_4_ + local_1320._12_4_;
          auVar80._16_4_ = local_1300._16_4_ + local_1300._16_4_;
          auVar80._20_4_ = local_1300._20_4_ + local_1300._20_4_;
          auVar80._24_4_ = local_1300._24_4_ + local_1300._24_4_;
          auVar80._28_4_ = local_1300._28_4_ + local_1300._28_4_;
          auVar46 = vcmpps_avx(auVar80,local_12e0,2);
          auVar51 = auVar46 & auVar64;
          if ((((((((auVar51 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar51 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar51 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar51 >> 0x7f,0) != '\0') ||
                (auVar51 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar51 >> 0xbf,0) != '\0') ||
              (auVar51 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar51[0x1f] < '\0') {
            auVar64 = vandps_avx(auVar64,auVar46);
            auVar45 = vpackssdw_avx(auVar64._0_16_,auVar64._16_16_);
            auVar22._4_4_ = fVar3 * auVar47._4_4_;
            auVar22._0_4_ = fVar2 * auVar47._0_4_;
            auVar22._8_4_ = fVar8 * auVar47._8_4_;
            auVar22._12_4_ = fVar9 * auVar47._12_4_;
            auVar22._16_4_ = auVar47._16_4_ * 0.0;
            auVar22._20_4_ = auVar47._20_4_ * 0.0;
            auVar22._24_4_ = auVar47._24_4_ * 0.0;
            auVar22._28_4_ = auVar47._28_4_;
            auVar49 = vfmadd213ps_fma(auVar16,ZEXT1632(auVar60),auVar22);
            auVar49 = vfmadd213ps_fma(auVar15,ZEXT1632(auVar50),ZEXT1632(auVar49));
            local_1300._0_4_ = (float)(uVar33 ^ auVar49._0_4_);
            local_1300._4_4_ = (float)(uVar28 ^ auVar49._4_4_);
            local_1300._8_4_ = (float)(uVar74 ^ auVar49._8_4_);
            local_1300._12_4_ = (float)(uVar75 ^ auVar49._12_4_);
            fVar66 = *(float *)(ray + k * 4 + 0x60);
            auVar23._4_4_ = local_12e0._4_4_ * fVar66;
            auVar23._0_4_ = local_12e0._0_4_ * fVar66;
            auVar23._8_4_ = local_12e0._8_4_ * fVar66;
            auVar23._12_4_ = local_12e0._12_4_ * fVar66;
            auVar23._16_4_ = local_12e0._16_4_ * fVar66;
            auVar23._20_4_ = local_12e0._20_4_ * fVar66;
            auVar23._24_4_ = local_12e0._24_4_ * fVar66;
            auVar23._28_4_ = fVar66;
            auVar64 = vcmpps_avx(auVar23,local_1300,1);
            fVar66 = *(float *)(ray + k * 4 + 0x100);
            auVar44 = ZEXT3264(CONCAT428(fVar66,CONCAT424(fVar66,CONCAT420(fVar66,CONCAT416(fVar66,
                                                  CONCAT412(fVar66,CONCAT48(fVar66,CONCAT44(fVar66,
                                                  fVar66))))))));
            auVar59._0_4_ = local_12e0._0_4_ * fVar66;
            auVar59._4_4_ = local_12e0._4_4_ * fVar66;
            auVar59._8_4_ = local_12e0._8_4_ * fVar66;
            auVar59._12_4_ = local_12e0._12_4_ * fVar66;
            auVar59._16_4_ = local_12e0._16_4_ * fVar66;
            auVar59._20_4_ = local_12e0._20_4_ * fVar66;
            auVar59._24_4_ = local_12e0._24_4_ * fVar66;
            auVar59._28_4_ = 0;
            auVar46 = vcmpps_avx(local_1300,auVar59,2);
            auVar64 = vandps_avx(auVar64,auVar46);
            auVar49 = vpackssdw_avx(auVar64._0_16_,auVar64._16_16_);
            auVar45 = vpand_avx(auVar45,auVar49);
            auVar64 = vpmovzxwd_avx2(auVar45);
            auVar64 = vpslld_avx2(auVar64,0x1f);
            if ((((((((auVar64 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar64 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar64 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar64 >> 0x7f,0) != '\0') ||
                  (auVar64 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar64 >> 0xbf,0) != '\0') ||
                (auVar64 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar64[0x1f] < '\0') {
              local_1440 = vpsrad_avx2(auVar64,0x1f);
              local_1340 = auVar62;
              local_12c0 = ZEXT1632(auVar50);
              local_12a0 = ZEXT1632(auVar60);
              local_1280 = ZEXT1632(auVar55);
              local_1260 = local_1440;
              local_1180 = local_1100;
              pSVar5 = context->scene;
              auVar46 = vrcpps_avx(local_12e0);
              auVar84._8_4_ = 0x3f800000;
              auVar84._0_8_ = 0x3f8000003f800000;
              auVar84._12_4_ = 0x3f800000;
              auVar84._16_4_ = 0x3f800000;
              auVar84._20_4_ = 0x3f800000;
              auVar84._24_4_ = 0x3f800000;
              auVar84._28_4_ = 0x3f800000;
              auVar49 = vfnmadd213ps_fma(local_12e0,auVar46,auVar84);
              auVar49 = vfmadd132ps_fma(ZEXT1632(auVar49),auVar46,auVar46);
              fVar66 = auVar49._0_4_;
              fVar69 = auVar49._4_4_;
              local_1200._4_4_ = fVar69 * local_1300._4_4_;
              local_1200._0_4_ = fVar66 * local_1300._0_4_;
              fVar70 = auVar49._8_4_;
              local_1200._8_4_ = fVar70 * local_1300._8_4_;
              fVar71 = auVar49._12_4_;
              local_1200._12_4_ = fVar71 * local_1300._12_4_;
              local_1200._16_4_ = local_1300._16_4_ * 0.0;
              local_1200._20_4_ = local_1300._20_4_ * 0.0;
              local_1200._24_4_ = local_1300._24_4_ * 0.0;
              local_1200._28_4_ = auVar46._28_4_;
              auVar65 = ZEXT3264(local_1200);
              auVar24._4_4_ = fVar69 * auVar62._4_4_;
              auVar24._0_4_ = fVar66 * auVar62._0_4_;
              auVar24._8_4_ = fVar70 * auVar62._8_4_;
              auVar24._12_4_ = fVar71 * auVar62._12_4_;
              auVar24._16_4_ = local_1300._16_4_ * 0.0;
              auVar24._20_4_ = local_1300._20_4_ * 0.0;
              auVar24._24_4_ = local_1300._24_4_ * 0.0;
              auVar24._28_4_ = local_1300._28_4_;
              auVar46 = vminps_avx(auVar24,auVar84);
              auVar25._4_4_ = fVar69 * local_1320._4_4_;
              auVar25._0_4_ = fVar66 * local_1320._0_4_;
              auVar25._8_4_ = fVar70 * local_1320._8_4_;
              auVar25._12_4_ = fVar71 * local_1320._12_4_;
              auVar25._16_4_ = local_1300._16_4_ * 0.0;
              auVar25._20_4_ = local_1300._20_4_ * 0.0;
              auVar25._24_4_ = local_1300._24_4_ * 0.0;
              auVar25._28_4_ = local_1300._28_4_;
              auVar51 = vminps_avx(auVar25,auVar84);
              auVar41 = vsubps_avx(auVar84,auVar46);
              auVar13 = vsubps_avx(auVar84,auVar51);
              local_1220 = vblendvps_avx(auVar51,auVar41,local_1100);
              local_1240 = vblendvps_avx(auVar46,auVar13,local_1100);
              fVar66 = local_1120._0_4_;
              local_11e0._0_4_ = auVar50._0_4_ * fVar66;
              fVar69 = local_1120._4_4_;
              local_11e0._4_4_ = auVar50._4_4_ * fVar69;
              fVar70 = local_1120._8_4_;
              local_11e0._8_4_ = auVar50._8_4_ * fVar70;
              fVar71 = local_1120._12_4_;
              local_11e0._12_4_ = auVar50._12_4_ * fVar71;
              fVar10 = local_1120._16_4_;
              local_11e0._16_4_ = fVar10 * 0.0;
              fVar11 = local_1120._20_4_;
              local_11e0._20_4_ = fVar11 * 0.0;
              fVar12 = local_1120._24_4_;
              local_11e0._24_4_ = fVar12 * 0.0;
              local_11e0._28_4_ = 0;
              local_11c0._0_4_ = fVar66 * auVar60._0_4_;
              local_11c0._4_4_ = fVar69 * auVar60._4_4_;
              local_11c0._8_4_ = fVar70 * auVar60._8_4_;
              local_11c0._12_4_ = fVar71 * auVar60._12_4_;
              local_11c0._16_4_ = fVar10 * 0.0;
              local_11c0._20_4_ = fVar11 * 0.0;
              local_11c0._24_4_ = fVar12 * 0.0;
              local_11c0._28_4_ = 0;
              local_11a0._0_4_ = fVar66 * fVar2;
              local_11a0._4_4_ = fVar69 * fVar3;
              local_11a0._8_4_ = fVar70 * fVar8;
              local_11a0._12_4_ = fVar71 * fVar9;
              local_11a0._16_4_ = fVar10 * 0.0;
              local_11a0._20_4_ = fVar11 * 0.0;
              local_11a0._24_4_ = fVar12 * 0.0;
              local_11a0._28_4_ = 0;
              auVar42._8_4_ = 0x7f800000;
              auVar42._0_8_ = 0x7f8000007f800000;
              auVar42._12_4_ = 0x7f800000;
              auVar42._16_4_ = 0x7f800000;
              auVar42._20_4_ = 0x7f800000;
              auVar42._24_4_ = 0x7f800000;
              auVar42._28_4_ = 0x7f800000;
              auVar64 = vblendvps_avx(auVar42,local_1200,auVar64);
              auVar46 = vshufps_avx(auVar64,auVar64,0xb1);
              auVar46 = vminps_avx(auVar64,auVar46);
              auVar51 = vshufpd_avx(auVar46,auVar46,5);
              auVar46 = vminps_avx(auVar46,auVar51);
              auVar51 = vpermpd_avx2(auVar46,0x4e);
              auVar46 = vminps_avx(auVar46,auVar51);
              auVar64 = vcmpps_avx(auVar64,auVar46,0);
              auVar49 = vpackssdw_avx(auVar64._0_16_,auVar64._16_16_);
              auVar45 = vpand_avx(auVar49,auVar45);
              auVar64 = vpmovzxwd_avx2(auVar45);
              auVar64 = vpslld_avx2(auVar64,0x1f);
              if ((((((((auVar64 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                       (auVar64 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                      (auVar64 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                     SUB321(auVar64 >> 0x7f,0) == '\0') &&
                    (auVar64 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                   SUB321(auVar64 >> 0xbf,0) == '\0') &&
                  (auVar64 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                  -1 < auVar64[0x1f]) {
                auVar64 = local_1440;
              }
              uVar28 = vmovmskps_avx(auVar64);
              uVar33 = 0;
              for (; (uVar28 & 1) == 0; uVar28 = uVar28 >> 1 | 0x80000000) {
                uVar33 = uVar33 + 1;
              }
              do {
                local_13d0 = auVar91._0_16_;
                uVar31 = (ulong)uVar33;
                uVar33 = *(uint *)((long)&local_10e0 + uVar31 * 4);
                pGVar6 = (pSVar5->geometries).items[uVar33].ptr;
                if ((pGVar6->mask & *(uint *)(ray + k * 4 + 0x120)) == 0) {
                  *(undefined4 *)(local_1440 + uVar31 * 4) = 0;
                }
                else {
                  if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                     (pGVar6->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                    uVar86 = *(undefined4 *)(local_1240 + uVar31 * 4);
                    uVar4 = *(undefined4 *)(local_1220 + uVar31 * 4);
                    *(undefined4 *)(ray + k * 4 + 0x100) = *(undefined4 *)(local_1200 + uVar31 * 4);
                    *(undefined4 *)(ray + k * 4 + 0x180) = *(undefined4 *)(local_11e0 + uVar31 * 4);
                    *(undefined4 *)(ray + k * 4 + 0x1a0) = *(undefined4 *)(local_11c0 + uVar31 * 4);
                    *(undefined4 *)(ray + k * 4 + 0x1c0) = *(undefined4 *)(local_11a0 + uVar31 * 4);
                    *(undefined4 *)(ray + k * 4 + 0x1e0) = uVar86;
                    *(undefined4 *)(ray + k * 4 + 0x200) = uVar4;
                    *(undefined4 *)(ray + k * 4 + 0x220) =
                         *(undefined4 *)((long)&local_1360 + uVar31 * 4);
                    *(uint *)(ray + k * 4 + 0x240) = uVar33;
                    *(uint *)(ray + k * 4 + 0x260) = context->user->instID[0];
                    *(uint *)(ray + k * 4 + 0x280) = context->user->instPrimID[0];
                    break;
                  }
                  local_1160 = auVar65._0_32_;
                  local_1420 = auVar44._0_32_;
                  uVar86 = *(undefined4 *)(local_1240 + uVar31 * 4);
                  local_1060._4_4_ = uVar86;
                  local_1060._0_4_ = uVar86;
                  local_1060._8_4_ = uVar86;
                  local_1060._12_4_ = uVar86;
                  local_1060._16_4_ = uVar86;
                  local_1060._20_4_ = uVar86;
                  local_1060._24_4_ = uVar86;
                  local_1060._28_4_ = uVar86;
                  local_1040 = *(undefined4 *)(local_1220 + uVar31 * 4);
                  uVar86 = *(undefined4 *)((long)&local_1360 + uVar31 * 4);
                  auVar55._4_4_ = uVar86;
                  auVar55._0_4_ = uVar86;
                  auVar55._8_4_ = uVar86;
                  auVar55._12_4_ = uVar86;
                  auVar57._16_4_ = uVar86;
                  auVar57._0_16_ = auVar55;
                  auVar57._20_4_ = uVar86;
                  auVar57._24_4_ = uVar86;
                  auVar57._28_4_ = uVar86;
                  uVar86 = *(undefined4 *)(local_11e0 + uVar31 * 4);
                  uVar4 = *(undefined4 *)(local_11c0 + uVar31 * 4);
                  local_10a0._4_4_ = uVar4;
                  local_10a0._0_4_ = uVar4;
                  local_10a0._8_4_ = uVar4;
                  local_10a0._12_4_ = uVar4;
                  local_10a0._16_4_ = uVar4;
                  local_10a0._20_4_ = uVar4;
                  local_10a0._24_4_ = uVar4;
                  local_10a0._28_4_ = uVar4;
                  uVar4 = *(undefined4 *)(local_11a0 + uVar31 * 4);
                  local_1080._4_4_ = uVar4;
                  local_1080._0_4_ = uVar4;
                  local_1080._8_4_ = uVar4;
                  local_1080._12_4_ = uVar4;
                  local_1080._16_4_ = uVar4;
                  local_1080._20_4_ = uVar4;
                  local_1080._24_4_ = uVar4;
                  local_1080._28_4_ = uVar4;
                  auVar50._4_4_ = uVar33;
                  auVar50._0_4_ = uVar33;
                  auVar50._8_4_ = uVar33;
                  auVar50._12_4_ = uVar33;
                  auVar53._16_4_ = uVar33;
                  auVar53._0_16_ = auVar50;
                  auVar53._20_4_ = uVar33;
                  auVar53._24_4_ = uVar33;
                  auVar53._28_4_ = uVar33;
                  local_10c0[0] = (RTCHitN)(char)uVar86;
                  local_10c0[1] = (RTCHitN)(char)((uint)uVar86 >> 8);
                  local_10c0[2] = (RTCHitN)(char)((uint)uVar86 >> 0x10);
                  local_10c0[3] = (RTCHitN)(char)((uint)uVar86 >> 0x18);
                  local_10c0[4] = (RTCHitN)(char)uVar86;
                  local_10c0[5] = (RTCHitN)(char)((uint)uVar86 >> 8);
                  local_10c0[6] = (RTCHitN)(char)((uint)uVar86 >> 0x10);
                  local_10c0[7] = (RTCHitN)(char)((uint)uVar86 >> 0x18);
                  local_10c0[8] = (RTCHitN)(char)uVar86;
                  local_10c0[9] = (RTCHitN)(char)((uint)uVar86 >> 8);
                  local_10c0[10] = (RTCHitN)(char)((uint)uVar86 >> 0x10);
                  local_10c0[0xb] = (RTCHitN)(char)((uint)uVar86 >> 0x18);
                  local_10c0[0xc] = (RTCHitN)(char)uVar86;
                  local_10c0[0xd] = (RTCHitN)(char)((uint)uVar86 >> 8);
                  local_10c0[0xe] = (RTCHitN)(char)((uint)uVar86 >> 0x10);
                  local_10c0[0xf] = (RTCHitN)(char)((uint)uVar86 >> 0x18);
                  local_10c0[0x10] = (RTCHitN)(char)uVar86;
                  local_10c0[0x11] = (RTCHitN)(char)((uint)uVar86 >> 8);
                  local_10c0[0x12] = (RTCHitN)(char)((uint)uVar86 >> 0x10);
                  local_10c0[0x13] = (RTCHitN)(char)((uint)uVar86 >> 0x18);
                  local_10c0[0x14] = (RTCHitN)(char)uVar86;
                  local_10c0[0x15] = (RTCHitN)(char)((uint)uVar86 >> 8);
                  local_10c0[0x16] = (RTCHitN)(char)((uint)uVar86 >> 0x10);
                  local_10c0[0x17] = (RTCHitN)(char)((uint)uVar86 >> 0x18);
                  local_10c0[0x18] = (RTCHitN)(char)uVar86;
                  local_10c0[0x19] = (RTCHitN)(char)((uint)uVar86 >> 8);
                  local_10c0[0x1a] = (RTCHitN)(char)((uint)uVar86 >> 0x10);
                  local_10c0[0x1b] = (RTCHitN)(char)((uint)uVar86 >> 0x18);
                  local_10c0[0x1c] = (RTCHitN)(char)uVar86;
                  local_10c0[0x1d] = (RTCHitN)(char)((uint)uVar86 >> 8);
                  local_10c0[0x1e] = (RTCHitN)(char)((uint)uVar86 >> 0x10);
                  local_10c0[0x1f] = (RTCHitN)(char)((uint)uVar86 >> 0x18);
                  uStack_103c = local_1040;
                  uStack_1038 = local_1040;
                  uStack_1034 = local_1040;
                  uStack_1030 = local_1040;
                  uStack_102c = local_1040;
                  uStack_1028 = local_1040;
                  uStack_1024 = local_1040;
                  local_1020 = auVar57;
                  local_1000 = auVar53;
                  vpcmpeqd_avx2(local_1060,local_1060);
                  uStack_fdc = context->user->instID[0];
                  local_fe0 = uStack_fdc;
                  uStack_fd8 = uStack_fdc;
                  uStack_fd4 = uStack_fdc;
                  uStack_fd0 = uStack_fdc;
                  uStack_fcc = uStack_fdc;
                  uStack_fc8 = uStack_fdc;
                  uStack_fc4 = uStack_fdc;
                  uStack_fbc = context->user->instPrimID[0];
                  local_fc0 = uStack_fbc;
                  uStack_fb8 = uStack_fbc;
                  uStack_fb4 = uStack_fbc;
                  uStack_fb0 = uStack_fbc;
                  uStack_fac = uStack_fbc;
                  uStack_fa8 = uStack_fbc;
                  uStack_fa4 = uStack_fbc;
                  *(undefined4 *)(ray + k * 4 + 0x100) = *(undefined4 *)(local_1200 + uVar31 * 4);
                  local_1400 = local_1140;
                  local_1470.valid = (int *)local_1400;
                  local_1470.geometryUserPtr = pGVar6->userPtr;
                  local_1470.context = context->user;
                  local_1470.hit = local_10c0;
                  local_1470.N = 8;
                  local_1470.ray = (RTCRayN *)ray;
                  if (pGVar6->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                    auVar53 = ZEXT1632(auVar50);
                    auVar57 = ZEXT1632(auVar55);
                    (*pGVar6->intersectionFilterN)(&local_1470);
                  }
                  auVar46 = vpcmpeqd_avx2(local_1400,_DAT_01faff00);
                  auVar64 = _DAT_01fe9960 & ~auVar46;
                  if ((((((((auVar64 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                           (auVar64 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                          (auVar64 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                         SUB321(auVar64 >> 0x7f,0) == '\0') &&
                        (auVar64 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                       SUB321(auVar64 >> 0xbf,0) == '\0') &&
                      (auVar64 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                      -1 < auVar64[0x1f]) {
                    auVar46 = auVar46 ^ _DAT_01fe9960;
                  }
                  else {
                    p_Var7 = context->args->filter;
                    if ((p_Var7 != (RTCFilterFunctionN)0x0) &&
                       (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                         RTC_RAY_QUERY_FLAG_INCOHERENT ||
                        (((pGVar6->field_8).field_0x2 & 0x40) != 0)))) {
                      auVar53 = ZEXT1632(auVar53._0_16_);
                      auVar57 = ZEXT1632(auVar57._0_16_);
                      (*p_Var7)(&local_1470);
                    }
                    auVar51 = vpcmpeqd_avx2(local_1400,_DAT_01faff00);
                    auVar64 = vpcmpeqd_avx2(auVar57,auVar57);
                    auVar46 = auVar51 ^ auVar64;
                    auVar41 = vpcmpeqd_avx2(auVar53,auVar53);
                    auVar64 = auVar64 & ~auVar51;
                    if ((((((((auVar64 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                             (auVar64 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                            (auVar64 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                           SUB321(auVar64 >> 0x7f,0) != '\0') ||
                          (auVar64 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                         SUB321(auVar64 >> 0xbf,0) != '\0') ||
                        (auVar64 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                        auVar64[0x1f] < '\0') {
                      auVar51 = auVar51 ^ auVar41;
                      auVar64 = vmaskmovps_avx(auVar51,*(undefined1 (*) [32])local_1470.hit);
                      *(undefined1 (*) [32])(local_1470.ray + 0x180) = auVar64;
                      auVar64 = vmaskmovps_avx(auVar51,*(undefined1 (*) [32])(local_1470.hit + 0x20)
                                              );
                      *(undefined1 (*) [32])(local_1470.ray + 0x1a0) = auVar64;
                      auVar64 = vmaskmovps_avx(auVar51,*(undefined1 (*) [32])(local_1470.hit + 0x40)
                                              );
                      *(undefined1 (*) [32])(local_1470.ray + 0x1c0) = auVar64;
                      auVar64 = vmaskmovps_avx(auVar51,*(undefined1 (*) [32])(local_1470.hit + 0x60)
                                              );
                      *(undefined1 (*) [32])(local_1470.ray + 0x1e0) = auVar64;
                      auVar64 = vmaskmovps_avx(auVar51,*(undefined1 (*) [32])(local_1470.hit + 0x80)
                                              );
                      *(undefined1 (*) [32])(local_1470.ray + 0x200) = auVar64;
                      auVar64 = vpmaskmovd_avx2(auVar51,*(undefined1 (*) [32])
                                                         (local_1470.hit + 0xa0));
                      *(undefined1 (*) [32])(local_1470.ray + 0x220) = auVar64;
                      auVar64 = vpmaskmovd_avx2(auVar51,*(undefined1 (*) [32])
                                                         (local_1470.hit + 0xc0));
                      *(undefined1 (*) [32])(local_1470.ray + 0x240) = auVar64;
                      auVar64 = vpmaskmovd_avx2(auVar51,*(undefined1 (*) [32])
                                                         (local_1470.hit + 0xe0));
                      *(undefined1 (*) [32])(local_1470.ray + 0x260) = auVar64;
                      auVar64 = vpmaskmovd_avx2(auVar51,*(undefined1 (*) [32])
                                                         (local_1470.hit + 0x100));
                      *(undefined1 (*) [32])(local_1470.ray + 0x280) = auVar64;
                    }
                  }
                  if ((((((((auVar46 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                           (auVar46 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                          (auVar46 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                         SUB321(auVar46 >> 0x7f,0) == '\0') &&
                        (auVar46 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                       SUB321(auVar46 >> 0xbf,0) == '\0') &&
                      (auVar46 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                      -1 < auVar46[0x1f]) {
                    *(undefined4 *)(ray + k * 4 + 0x100) = local_1420._0_4_;
                  }
                  else {
                    local_1420 = ZEXT432(*(uint *)(ray + k * 4 + 0x100));
                  }
                  *(undefined4 *)(local_1440 + uVar31 * 4) = 0;
                  auVar44 = ZEXT3264(local_1420);
                  uVar86 = local_1420._0_4_;
                  auVar43._4_4_ = uVar86;
                  auVar43._0_4_ = uVar86;
                  auVar43._8_4_ = uVar86;
                  auVar43._12_4_ = uVar86;
                  auVar43._16_4_ = uVar86;
                  auVar43._20_4_ = uVar86;
                  auVar43._24_4_ = uVar86;
                  auVar43._28_4_ = uVar86;
                  auVar65 = ZEXT3264(local_1160);
                  auVar64 = vcmpps_avx(local_1160,auVar43,2);
                  local_1440 = vandps_avx(auVar64,local_1440);
                  auVar91 = ZEXT1664(local_13d0);
                }
                if ((((((((local_1440 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                         (local_1440 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                        (local_1440 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                       SUB321(local_1440 >> 0x7f,0) == '\0') &&
                      (local_1440 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                     SUB321(local_1440 >> 0xbf,0) == '\0') &&
                    (local_1440 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                    -1 < local_1440[0x1f]) break;
                auVar48._8_4_ = 0x7f800000;
                auVar48._0_8_ = 0x7f8000007f800000;
                auVar48._12_4_ = 0x7f800000;
                auVar48._16_4_ = 0x7f800000;
                auVar48._20_4_ = 0x7f800000;
                auVar48._24_4_ = 0x7f800000;
                auVar48._28_4_ = 0x7f800000;
                auVar64 = vblendvps_avx(auVar48,auVar65._0_32_,local_1440);
                auVar46 = vshufps_avx(auVar64,auVar64,0xb1);
                auVar46 = vminps_avx(auVar64,auVar46);
                auVar51 = vshufpd_avx(auVar46,auVar46,5);
                auVar46 = vminps_avx(auVar46,auVar51);
                auVar51 = vpermpd_avx2(auVar46,0x4e);
                auVar46 = vminps_avx(auVar46,auVar51);
                auVar46 = vcmpps_avx(auVar64,auVar46,0);
                auVar51 = local_1440 & auVar46;
                auVar64 = local_1440;
                if ((((((((auVar51 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                         (auVar51 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        (auVar51 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                       SUB321(auVar51 >> 0x7f,0) != '\0') ||
                      (auVar51 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                     SUB321(auVar51 >> 0xbf,0) != '\0') ||
                    (auVar51 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                    auVar51[0x1f] < '\0') {
                  auVar64 = vandps_avx(auVar46,local_1440);
                }
                uVar28 = vmovmskps_avx(auVar64);
                uVar33 = 0;
                for (; (uVar28 & 1) == 0; uVar28 = uVar28 >> 1 | 0x80000000) {
                  uVar33 = uVar33 + 1;
                }
              } while( true );
            }
          }
          lVar36 = lVar36 + 1;
        } while (lVar36 != uVar38 - 8);
      }
      uVar86 = *(undefined4 *)(ray + k * 4 + 0x100);
      auVar44 = ZEXT1664(CONCAT412(uVar86,CONCAT48(uVar86,CONCAT44(uVar86,uVar86))));
      auVar65 = ZEXT1664(local_1370);
      auVar68 = ZEXT1664(local_1380);
      auVar73 = ZEXT1664(local_1390);
      auVar78 = ZEXT1664(local_13a0);
      auVar81 = ZEXT1664(local_13b0);
      auVar85 = ZEXT1664(local_13c0);
    }
    if (pauVar29 == (undefined1 (*) [16])&local_fa0) {
      return;
    }
  } while( true );
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::intersect1(Accel::Intersectors* This,
                                                                                                const BVH* bvh,
                                                                                                NodeRef root,
                                                                                                size_t k,
                                                                                                Precalculations& pre,
                                                                                                RayHitK<K>& ray,
                                                                                                const TravRayK<K, robust>& tray,
                                                                                                RayQueryContext* context)
    {
      /* stack state */
      StackItemT<NodeRef> stack[stackSizeSingle];  // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack + 1;   // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack + stackSizeSingle;
      stack[0].ptr = root;
      stack[0].dist = neg_inf;

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray1;
      tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar[k]))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes, 1, 1, 1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          BVHNNodeTraverser1Hit<N, types>::traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves, 1, 1, 1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

        size_t lazy_node = 0;
        PrimitiveIntersectorK::intersect(This, pre, ray, k, context, prim, num, tray1, lazy_node);

        tray1.tfar = ray.tfar[k];

        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }